

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O3

uint64_t bidfx_public_api::tools::Varint::ReadU64(InputStream *stream)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = 0;
  uVar3 = 0;
  do {
    iVar1 = (**stream->_vptr_InputStream)(stream);
    uVar2 = (ulong)((byte)iVar1 & 0x7f) << ((byte)uVar3 & 0x3f) | uVar2;
    if (-1 < (char)(byte)iVar1) {
      return uVar2;
    }
    bVar4 = uVar3 < 0x39;
    uVar3 = uVar3 + 7;
  } while (bVar4);
  return uVar2;
}

Assistant:

uint64_t Varint::ReadU64(InputStream& stream)
{
    unsigned long long result = 0L;
    for (int offset = 0; offset < 64; offset += kBitsPerByte)
    {
        unsigned char next_byte = stream.ReadByte();
        result |= (unsigned long long) (next_byte & kMaskLow7Bits) << offset;
        if (IsFinalByte(next_byte))
        {
            break;
        }
    }
    return result;
}